

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

TypedExpectation<double_(const_char_*,_char_**,___locale_struct_*)> * __thiscall
testing::internal::TypedExpectation<double_(const_char_*,_char_**,___locale_struct_*)>::WillOnce
          (TypedExpectation<double_(const_char_*,_char_**,___locale_struct_*)> *this,
          Action<double_(const_char_*,_char_**,___locale_struct_*)> *action)

{
  bool bVar1;
  void *pvVar2;
  TypedExpectation<double_(const_char_*,_char_**,___locale_struct_*)> *in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  ExpectationBase *in_stack_ffffffffffffff70;
  ExpectationBase *this_00;
  undefined1 local_60 [47];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation()."
             ,&local_31);
  ExpectationBase::ExpectSpecProperty
            (in_stack_ffffffffffffff70,SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0),
             (string *)0x11ae04);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (in_RDI->super_ExpectationBase).last_clause_ = kWillOnce;
  pvVar2 = operator_new(0x10);
  Action<double_(const_char_*,_char_**,___locale_struct_*)>::Action
            ((Action<double_(const_char_*,_char_**,___locale_struct_*)> *)in_stack_ffffffffffffff70,
             (Action<double_(const_char_*,_char_**,___locale_struct_*)> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_60._16_8_ = pvVar2;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::push_back
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)in_stack_ffffffffffffff70,
             (value_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = ExpectationBase::cardinality_specified(&in_RDI->super_ExpectationBase);
  if (!bVar1) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::size
              (&(in_RDI->super_ExpectationBase).untyped_actions_);
    this_00 = (ExpectationBase *)local_60;
    Exactly(in_stack_ffffffffffffff6c);
    ExpectationBase::set_cardinality
              (this_00,(Cardinality *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    Cardinality::~Cardinality((Cardinality *)0x11aec0);
  }
  return in_RDI;
}

Assistant:

TypedExpectation& WillOnce(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ <= kWillOnce,
                       ".WillOnce() cannot appear after "
                       ".WillRepeatedly() or .RetiresOnSaturation().");
    last_clause_ = kWillOnce;

    untyped_actions_.push_back(new Action<F>(action));
    if (!cardinality_specified()) {
      set_cardinality(Exactly(static_cast<int>(untyped_actions_.size())));
    }
    return *this;
  }